

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushFocusScope(ImGuiID id)

{
  int *piVar1;
  ImGuiWindow *pIVar2;
  uint *puVar3;
  ImGuiContext *ctx;
  uint *__dest;
  int iVar4;
  int iVar5;
  int iVar6;
  
  pIVar2 = GImGui->CurrentWindow;
  iVar4 = (pIVar2->IDStack).Size;
  if (iVar4 == (pIVar2->IDStack).Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
    puVar3 = (pIVar2->IDStack).Data;
    if (puVar3 != (uint *)0x0) {
      memcpy(__dest,puVar3,(long)(pIVar2->IDStack).Size << 2);
      puVar3 = (pIVar2->IDStack).Data;
      if ((puVar3 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
    }
    (pIVar2->IDStack).Data = __dest;
    (pIVar2->IDStack).Capacity = iVar6;
    iVar4 = (pIVar2->IDStack).Size;
  }
  else {
    __dest = (pIVar2->IDStack).Data;
  }
  __dest[iVar4] = (pIVar2->DC).NavFocusScopeIdCurrent;
  (pIVar2->IDStack).Size = (pIVar2->IDStack).Size + 1;
  (pIVar2->DC).NavFocusScopeIdCurrent = id;
  return;
}

Assistant:

void ImGui::PushFocusScope(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->IDStack.push_back(window->DC.NavFocusScopeIdCurrent);
    window->DC.NavFocusScopeIdCurrent = id;
}